

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O0

int fiobj_iseq_simple(FIOBJ o,FIOBJ o2)

{
  fiobj_object_vtable_s *pfVar1;
  size_t sVar2;
  FIOBJ o2_local;
  FIOBJ o_local;
  
  if (o == o2) {
    o_local._4_4_ = 1;
  }
  else if ((o == 0) || (o2 == 0)) {
    o_local._4_4_ = 0;
  }
  else if (((o == 0) || ((((o & 1) != 0 || ((o & 6) == 6)) || (o2 == 0)))) ||
          (((o2 & 1) != 0 || ((o2 & 6) == 6)))) {
    o_local._4_4_ = 0;
  }
  else if (*(char *)(o & 0xfffffffffffffff8) == *(char *)(o2 & 0xfffffffffffffff8)) {
    pfVar1 = fiobj_type_vtable(o);
    sVar2 = (*pfVar1->is_eq)(o,o2);
    if (sVar2 == 0) {
      o_local._4_4_ = 0;
    }
    else {
      o_local._4_4_ = 1;
    }
  }
  else {
    o_local._4_4_ = 0;
  }
  return o_local._4_4_;
}

Assistant:

static inline int fiobj_iseq_simple(const FIOBJ o, const FIOBJ o2) {
  if (o == o2)
    return 1;
  if (!o || !o2)
    return 0; /* they should have compared equal before. */
  if (!FIOBJ_IS_ALLOCATED(o) || !FIOBJ_IS_ALLOCATED(o2))
    return 0; /* they should have compared equal before. */
  if (FIOBJECT2HEAD(o)->type != FIOBJECT2HEAD(o2)->type)
    return 0; /* non-type equality is a barriar to equality. */
  if (!FIOBJECT2VTBL(o)->is_eq(o, o2))
    return 0;
  return 1;
}